

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::(anonymous_namespace)::
     convert_buffer_generic<pugi::impl::(anonymous_namespace)::utf16_decoder<pugi::impl::(anonymous_namespace)::opt_false>>
               (long *param_1,long *param_2,undefined8 param_3,ulong param_4)

{
  value_type vVar1;
  long lVar2;
  value_type puVar3;
  uint8_t *oend;
  uint8_t *obegin;
  char_t *buffer;
  size_t length;
  size_t data_length;
  type *data;
  
  vVar1 = anon_unknown_0::utf16_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
          process<pugi::impl::(anonymous_namespace)::utf8_counter>(param_3,param_4 >> 1,0);
  lVar2 = (*(code *)xml_memory_management_function_storage<int>::allocate)(vVar1 + 1);
  if (lVar2 != 0) {
    puVar3 = anon_unknown_0::utf16_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
             process<pugi::impl::(anonymous_namespace)::utf8_writer>(param_3,param_4 >> 1,lVar2);
    *puVar3 = '\0';
    *param_1 = lVar2;
    *param_2 = vVar1 + 1;
  }
  return lVar2 != 0;
}

Assistant:

PUGI__FN bool convert_buffer_generic(char_t*& out_buffer, size_t& out_length, const void* contents, size_t size, D)
	{
		const typename D::type* data = static_cast<const typename D::type*>(contents);
		size_t data_length = size / sizeof(typename D::type);

		// first pass: get length in utf8 units
		size_t length = D::process(data, data_length, 0, utf8_counter());

		// allocate buffer of suitable length
		char_t* buffer = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
		if (!buffer) return false;

		// second pass: convert utf16 input to utf8
		uint8_t* obegin = reinterpret_cast<uint8_t*>(buffer);
		uint8_t* oend = D::process(data, data_length, obegin, utf8_writer());

		assert(oend == obegin + length);
		*oend = 0;

		out_buffer = buffer;
		out_length = length + 1;

		return true;
	}